

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

void __thiscall HEkk::unscaleSimplex(HEkk *this,HighsLp *incumbent_lp)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  pointer pdVar12;
  pointer pdVar13;
  pointer piVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  double dVar18;
  
  if (this->simplex_in_scaled_space_ == true) {
    iVar1 = incumbent_lp->num_col_;
    lVar15 = (long)iVar1;
    uVar2 = incumbent_lp->num_row_;
    if (0 < lVar15) {
      pdVar4 = (incumbent_lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar5 = (this->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->info_).workShift_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar10 = (this->info_).workRange_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start;
      pdVar11 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start;
      pdVar12 = (this->info_).workLowerShift_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pdVar13 = (this->info_).workUpperShift_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar16 = 0;
      do {
        dVar18 = *(double *)((long)pdVar4 + lVar16);
        *(double *)((long)pdVar5 + lVar16) = *(double *)((long)pdVar5 + lVar16) / dVar18;
        *(double *)((long)pdVar6 + lVar16) = *(double *)((long)pdVar6 + lVar16) / dVar18;
        *(double *)((long)pdVar7 + lVar16) = *(double *)((long)pdVar7 + lVar16) / dVar18;
        *(double *)((long)pdVar8 + lVar16) = *(double *)((long)pdVar8 + lVar16) * dVar18;
        *(double *)((long)pdVar9 + lVar16) = *(double *)((long)pdVar9 + lVar16) * dVar18;
        *(double *)((long)pdVar10 + lVar16) = *(double *)((long)pdVar10 + lVar16) * dVar18;
        *(double *)((long)pdVar11 + lVar16) = *(double *)((long)pdVar11 + lVar16) * dVar18;
        *(double *)((long)pdVar12 + lVar16) = *(double *)((long)pdVar12 + lVar16) * dVar18;
        *(double *)((long)pdVar13 + lVar16) = dVar18 * *(double *)((long)pdVar13 + lVar16);
        lVar16 = lVar16 + 8;
      } while (lVar15 * 8 - lVar16 != 0);
    }
    if (0 < (int)uVar2) {
      pdVar4 = (incumbent_lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar15 = lVar15 * 8;
      pdVar5 = (this->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->info_).workShift_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar10 = (this->info_).workRange_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start;
      pdVar11 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start;
      pdVar12 = (this->info_).workLowerShift_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pdVar13 = (this->info_).workUpperShift_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar16 = 0;
      do {
        dVar18 = *(double *)((long)pdVar4 + lVar16);
        *(double *)((long)pdVar5 + lVar16 + lVar15) =
             *(double *)((long)pdVar5 + lVar16 + lVar15) * dVar18;
        *(double *)((long)pdVar6 + lVar16 + lVar15) =
             *(double *)((long)pdVar6 + lVar16 + lVar15) * dVar18;
        *(double *)((long)pdVar7 + lVar16 + lVar15) =
             *(double *)((long)pdVar7 + lVar16 + lVar15) * dVar18;
        *(double *)((long)pdVar8 + lVar16 + lVar15) =
             *(double *)((long)pdVar8 + lVar16 + lVar15) / dVar18;
        *(double *)((long)pdVar9 + lVar16 + lVar15) =
             *(double *)((long)pdVar9 + lVar16 + lVar15) / dVar18;
        *(double *)((long)pdVar10 + lVar16 + lVar15) =
             *(double *)((long)pdVar10 + lVar16 + lVar15) / dVar18;
        *(double *)((long)pdVar11 + lVar16 + lVar15) =
             *(double *)((long)pdVar11 + lVar16 + lVar15) / dVar18;
        *(double *)((long)pdVar12 + lVar16 + lVar15) =
             *(double *)((long)pdVar12 + lVar16 + lVar15) / dVar18;
        *(double *)((long)pdVar13 + lVar16 + lVar15) =
             *(double *)((long)pdVar13 + lVar16 + lVar15) / dVar18;
        lVar16 = lVar16 + 8;
      } while ((ulong)uVar2 * 8 - lVar16 != 0);
    }
    if (0 < (int)uVar2) {
      piVar14 = (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar4 = (incumbent_lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar5 = (incumbent_lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar6 = (this->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar17 = 0;
      do {
        iVar3 = piVar14[uVar17];
        if (iVar3 < iVar1) {
          dVar18 = pdVar4[iVar3];
        }
        else {
          dVar18 = 1.0 / pdVar5[iVar3 - iVar1];
        }
        pdVar6[uVar17] = pdVar6[uVar17] * dVar18;
        pdVar7[uVar17] = pdVar7[uVar17] * dVar18;
        pdVar8[uVar17] = dVar18 * pdVar8[uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar2 != uVar17);
    }
    this->simplex_in_scaled_space_ = false;
  }
  return;
}

Assistant:

void HEkk::unscaleSimplex(const HighsLp& incumbent_lp) {
  if (!this->simplex_in_scaled_space_) return;
  assert(incumbent_lp.scale_.has_scaling);
  const HighsInt num_col = incumbent_lp.num_col_;
  const HighsInt num_row = incumbent_lp.num_row_;
  const vector<double>& col_scale = incumbent_lp.scale_.col;
  const vector<double>& row_scale = incumbent_lp.scale_.row;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    const HighsInt iVar = iCol;
    const double factor = col_scale[iCol];
    this->info_.workCost_[iVar] /= factor;
    this->info_.workDual_[iVar] /= factor;
    this->info_.workShift_[iVar] /= factor;
    this->info_.workLower_[iVar] *= factor;
    this->info_.workUpper_[iVar] *= factor;
    this->info_.workRange_[iVar] *= factor;
    this->info_.workValue_[iVar] *= factor;
    this->info_.workLowerShift_[iVar] *= factor;
    this->info_.workUpperShift_[iVar] *= factor;
  }
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    const HighsInt iVar = num_col + iRow;
    const double factor = row_scale[iRow];
    this->info_.workCost_[iVar] *= factor;
    this->info_.workDual_[iVar] *= factor;
    this->info_.workShift_[iVar] *= factor;
    this->info_.workLower_[iVar] /= factor;
    this->info_.workUpper_[iVar] /= factor;
    this->info_.workRange_[iVar] /= factor;
    this->info_.workValue_[iVar] /= factor;
    this->info_.workLowerShift_[iVar] /= factor;
    this->info_.workUpperShift_[iVar] /= factor;
  }
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    double factor;
    const HighsInt iVar = this->basis_.basicIndex_[iRow];
    if (iVar < num_col) {
      factor = col_scale[iVar];
    } else {
      factor = 1.0 / row_scale[iVar - num_col];
    }
    this->info_.baseLower_[iRow] *= factor;
    this->info_.baseUpper_[iRow] *= factor;
    this->info_.baseValue_[iRow] *= factor;
  }
  this->simplex_in_scaled_space_ = false;
}